

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O2

void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)

{
  undefined1 auVar1 [16];
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar2 = pSCurvePosCtrl->Spd;
  fVar4 = pSCurvePosCtrl->Cycle;
  fVar6 = pSCurvePosCtrl->Acc;
  uVar7 = 0;
  fVar5 = pSCurvePosCtrl->Dec;
  fVar13 = fVar5 * fVar4 - fVar2;
  fVar12 = fVar6 + fVar5;
  fVar9 = (fVar6 * fVar13) / fVar12;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 =
       ((fVar6 * fVar4 + fVar2) / fVar12) * (fVar9 + fVar2) * 0.5 +
       ((fVar2 + fVar2 + fVar9) * 0.5 * fVar13) / fVar12;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 =
       ((fVar4 + fVar4) - ABS(fVar2) / fVar6) * fVar2 * 0.5;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 = (fVar2 * 0.5 * ABS(fVar2)) / fVar6;
  fVar9 = -fVar5 * fVar4 - fVar2;
  fVar13 = -fVar6 - fVar5;
  fVar12 = (fVar6 * fVar9) / fVar13;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 =
       ((fVar2 - fVar6 * fVar4) / fVar13) * (fVar2 - fVar12) * 0.5 +
       (((fVar2 + fVar2) - fVar12) * 0.5 * fVar9) / fVar13;
  do {
    fVar9 = pSCurvePosCtrl->DeltaPos;
    fVar12 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0;
    if (fVar2 <= 0.0) {
      if (fVar9 <= fVar12) {
        if ((fVar12 < fVar9) || (fVar9 <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)) {
          fVar12 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1;
          if ((pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 < fVar9) || (fVar9 <= fVar12))
          goto LAB_0010b564;
          fVar5 = -fVar6;
          goto LAB_0010b36b;
        }
LAB_0010b363:
        fVar5 = ABS(fVar6);
        goto LAB_0010b36b;
      }
LAB_0010b33c:
      fVar6 = fVar6 + pSCurvePosCtrl->AccStep;
LAB_0010b341:
      pSCurvePosCtrl->Acc = fVar6;
      fVar5 = fVar6;
LAB_0010b36b:
      pSCurvePosCtrl->Dec = fVar5;
    }
    else {
      if (fVar12 < fVar9) goto LAB_0010b33c;
      if ((fVar9 <= fVar12) && (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 < fVar9))
      goto LAB_0010b363;
      fVar12 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2;
      if ((fVar9 <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1) && (fVar12 < fVar9)) {
        uVar7 = uVar7 ^ 0x80000000;
        pSCurvePosCtrl->Acc = -fVar6;
        fVar5 = ABS(fVar6);
        fVar6 = -fVar6;
        goto LAB_0010b36b;
      }
LAB_0010b564:
      if ((fVar9 <= fVar12) && (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 < fVar9)) {
        fVar6 = -fVar6;
        uVar7 = uVar7 ^ 0x80000000;
        goto LAB_0010b341;
      }
      if (fVar9 <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) {
        uVar7 = uVar7 ^ 0x80000000;
        fVar5 = -fVar6;
        if (fVar6 <= -fVar6) {
          fVar5 = fVar6;
        }
        fVar6 = fVar5 - pSCurvePosCtrl->AccStep;
        pSCurvePosCtrl->Acc = fVar6;
        fVar5 = fVar6;
        goto LAB_0010b36b;
      }
    }
    fVar12 = fVar6 / fVar5 + 1.0;
    fVar14 = (fVar2 * -2.0) / fVar5 + fVar4 + fVar4;
    fVar10 = (fVar4 + fVar4) * fVar2;
    auVar8._0_4_ = -fVar2;
    fVar13 = (fVar9 + fVar9) / fVar6 - (fVar10 * fVar5 + fVar2 * auVar8._0_4_) / (fVar6 * fVar5);
    if (0.0001 <= ABS(fVar12)) {
      dVar3 = (double)(fVar14 * fVar14 + fVar12 * -4.0 * fVar13);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      fVar9 = (float)(((double)fVar14 - dVar3) / (double)(fVar12 + fVar12));
      pSCurvePosCtrl->AccTime = fVar9;
      fVar2 = pSCurvePosCtrl->Spd;
      fVar4 = pSCurvePosCtrl->Cycle;
      fVar6 = pSCurvePosCtrl->Acc;
      uVar7 = 0;
      fVar5 = pSCurvePosCtrl->Dec;
      fVar10 = (fVar6 * fVar9 + fVar2) / fVar5;
    }
    else {
      auVar8._4_4_ = (fVar9 + fVar9 + (fVar2 * auVar8._0_4_) / fVar6) - fVar10;
      auVar8._8_4_ = 0x80000000;
      auVar8._12_4_ = 0;
      auVar1._4_4_ = fVar2 + fVar2 + (fVar6 + fVar6) * fVar4;
      auVar1._0_4_ = fVar6;
      auVar1._8_4_ = uVar7;
      auVar1._12_4_ = 0;
      auVar8 = divps(auVar8,auVar1);
      fVar9 = auVar8._4_4_;
      pSCurvePosCtrl->AccTime = fVar9;
      fVar10 = auVar8._0_4_ - fVar9;
    }
    pSCurvePosCtrl->DecTime = fVar10;
    fVar11 = (fVar4 - fVar9) - fVar10;
    pSCurvePosCtrl->MidTime = fVar11;
    if ((((0.0 <= fVar9) && (0.0 <= fVar10)) && (0.0 <= fVar11)) &&
       (0.0 <= fVar14 * fVar14 + fVar12 * -4.0 * fVar13)) {
      return;
    }
  } while( true );
}

Assistant:

static void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)
{
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 = 0.5f * (2.0f * pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * ((pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec));
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 = 0.5f * pSCurvePosCtrl->Spd * (2.0f * pSCurvePosCtrl->Cycle - fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc);
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 = 0.5f * pSCurvePosCtrl->Spd * fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 = 0.5f * (2.0f * pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * ((-pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec));

	while (1)
	{
		if (pSCurvePosCtrl->Spd > 0)
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}
		else
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = -pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}

		float coeff_a = 1.0f + pSCurvePosCtrl->Acc / pSCurvePosCtrl->Dec;
		float coeff_b = -(2.0f * pSCurvePosCtrl->Cycle - 2.0f * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Dec);
		float coeff_c = -(2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd * pSCurvePosCtrl->Dec - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc * pSCurvePosCtrl->Dec) + 2.0f * pSCurvePosCtrl->DeltaPos / pSCurvePosCtrl->Acc;

		if (fabs(coeff_a) < SCURVE_EQUAL_ERROR)
		{
			pSCurvePosCtrl->AccTime = (2.0f * pSCurvePosCtrl->DeltaPos - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - 2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd) / (2.0f * pSCurvePosCtrl->Spd + 2.0f * pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle);
			pSCurvePosCtrl->DecTime = -pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccTime;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}
		else
		{
			pSCurvePosCtrl->AccTime = (-coeff_b - sqrt(coeff_b * coeff_b - 4.0f * coeff_a * coeff_c)) / (2.0f * coeff_a);
			pSCurvePosCtrl->DecTime = (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * pSCurvePosCtrl->AccTime) / pSCurvePosCtrl->Dec;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}

		if (pSCurvePosCtrl->AccTime >= 0 && pSCurvePosCtrl->DecTime >= 0 && pSCurvePosCtrl->MidTime >= 0 && coeff_b * coeff_b - 4.0f * coeff_a * coeff_c >= 0.0f)
		{
			//printf("acc:%f dec:%f", pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
			break;
		}
		//printf("AccTime:%f DecTime:%f MidTime:%f det:%f acc:%f dec:%f\n", pSCurvePosCtrl->AccTime, pSCurvePosCtrl->DecTime, pSCurvePosCtrl->MidTime, coeff_b * coeff_b - 4.0f * coeff_a * coeff_c, pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
	}
}